

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O2

double __thiscall IF97::Region3::deltatau_d2phi_ddelta_dtau(Region3 *this,double T,double rho)

{
  double dVar1;
  int iVar2;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = 0.0;
  for (lVar3 = 0; lVar3 != 0x9c; lVar3 = lVar3 + 4) {
    iVar2 = *(int *)((long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + lVar3 + 4);
    dVar1 = *(double *)
             ((long)(this->nr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar3 * 2 + 8);
    i = *(int *)((long)(this->Ir).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3 + 4);
    dVar5 = powi(rho / 322.0,i);
    dVar6 = powi(647.096 / T,
                 *(int *)((long)(this->Jr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar3 + 4));
    dVar4 = dVar4 + dVar6 * dVar5 * (double)i * (double)iVar2 * dVar1;
  }
  return dVar4;
}

Assistant:

double deltatau_d2phi_ddelta_dtau(double T, double rho) const{
            const double delta = rho/Rhocrit, tau = Tcrit/T;
            double summer = 0;
            for (std::size_t i = 1; i < 40; ++i){
                summer += nr[i]*Jr[i]*Ir[i]*powi(delta, Ir[i])*powi(tau, Jr[i]);
            }
            return summer;
        }